

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

ssize_t __thiscall
kj::anon_unknown_31::PromiseOutputStream::write
          (PromiseOutputStream *this,int __fd,void *__buf,size_t __n)

{
  Event *pEVar1;
  PromiseNode *pPVar2;
  EventLoop *this_00;
  undefined4 in_register_00000034;
  Own<kj::_::ChainPromiseNode> OVar3;
  undefined1 local_58 [8];
  PromiseNode *local_50;
  Own<kj::_::PromiseNode> local_48;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  pEVar1 = ((Event **)CONCAT44(in_register_00000034,__fd))[4];
  if (pEVar1 == (Event *)0x0) {
    _::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_58);
    this_00 = (EventLoop *)operator_new(0x40);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)this_00,(Own<kj::_::PromiseNode> *)local_58,
               _::
               TransformPromiseNode<kj::Promise<void>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:3541:39),_kj::_::PropagateException>
               ::anon_class_24_2_4df0a340_for_func::operator());
    ((PromiseNode *)&this_00->port)->_vptr_PromiseNode = (_func_int **)&PTR_onReady_00445260;
    this_00->depthFirstInsertPoint = (Event **)CONCAT44(in_register_00000034,__fd);
    (this_00->daemons).disposer = (Disposer *)__buf;
    (this_00->daemons).ptr = (TaskSet *)__n;
    local_48.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::_::Void,kj::(anonymous_namespace)::PromiseOutputStream::write(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::{lambda()#1},kj::_::PropagateException>>
          ::instance;
    local_48.ptr = (PromiseNode *)this_00;
    OVar3 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_38,&local_48);
    pPVar2 = local_48.ptr;
    *(undefined4 *)&(this->super_AsyncOutputStream)._vptr_AsyncOutputStream = local_38;
    *(undefined4 *)((long)&(this->super_AsyncOutputStream)._vptr_AsyncOutputStream + 4) = uStack_34;
    *(undefined4 *)&(this->promise).hub.disposer = uStack_30;
    *(undefined4 *)((long)&(this->promise).hub.disposer + 4) = uStack_2c;
    if ((EventLoop *)local_48.ptr != (EventLoop *)0x0) {
      local_48.ptr = (PromiseNode *)0x0;
      (**(local_48.disposer)->_vptr_Disposer)
                (local_48.disposer,
                 ((PromiseNode *)&pPVar2->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                 (long)&((PromiseNode *)&pPVar2->_vptr_PromiseNode)->_vptr_PromiseNode,OVar3.ptr);
    }
    pPVar2 = local_50;
    if (local_50 != (PromiseNode *)0x0) {
      local_50 = (PromiseNode *)0x0;
      (**(code **)*(_func_int **)local_58)
                (local_58,pPVar2->_vptr_PromiseNode[-2] + (long)&pPVar2->_vptr_PromiseNode);
    }
  }
  else {
    (*pEVar1->_vptr_Event[1])(this,pEVar1,__buf,__n);
  }
  return (ssize_t)this;
}

Assistant:

KJ_IF_MAYBE(s, stream) {
      return s->get()->write(pieces);
    }